

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O1

Gia_Man_t * Gia_ManDupWithNewPo(Gia_Man_t *p1,Gia_Man_t *p2)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *p;
  size_t sVar6;
  char *pcVar7;
  Gia_Obj_t *pGVar8;
  Vec_Int_t *pVVar9;
  Gia_Man_t *pGVar10;
  ulong uVar11;
  int iVar12;
  Gia_Obj_t *pGVar13;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  
  if (p2->nRegs != 0) {
    __assert_fail("Gia_ManRegNum(p2) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                  ,0x91e,"Gia_Man_t *Gia_ManDupWithNewPo(Gia_Man_t *, Gia_Man_t *)");
  }
  if (p2->vCis->nSize != p1->nRegs) {
    __assert_fail("Gia_ManPiNum(p2) == Gia_ManRegNum(p1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/giaDup.c"
                  ,0x922,"Gia_Man_t *Gia_ManDupWithNewPo(Gia_Man_t *, Gia_Man_t *)");
  }
  p = Gia_ManStart(p2->nObjs + p1->nObjs);
  pcVar2 = p1->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p->pName = pcVar7;
  pcVar2 = p1->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar2);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar2);
  }
  p->pSpec = pcVar7;
  Gia_ManHashAlloc(p);
  p1->pObjs->Value = 0;
  pVVar9 = p1->vCis;
  if (0 < pVVar9->nSize) {
    lVar18 = 0;
    do {
      iVar5 = pVVar9->pArray[lVar18];
      if (((long)iVar5 < 0) || (p1->nObjs <= iVar5)) goto LAB_001e37ae;
      pGVar13 = p1->pObjs;
      if (pGVar13 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p);
      uVar11 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar11 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar11 & 0xe0000000ffffffff | 0x9fffffff | (ulong)(p->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar3 = p->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p->nObjs <= pGVar8)) {
LAB_001e37cd:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d4,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * -0x55555555);
      pGVar3 = p->pObjs;
      if ((pGVar8 < pGVar3) || (pGVar3 + p->nObjs <= pGVar8)) goto LAB_001e37cd;
      pGVar13[iVar5].Value = (int)((ulong)((long)pGVar8 - (long)pGVar3) >> 2) * 0x55555556;
      lVar18 = lVar18 + 1;
      pVVar9 = p1->vCis;
    } while (lVar18 < pVVar9->nSize);
  }
  iVar5 = p1->nObjs;
  if ((0 < iVar5) && (pGVar13 = p1->pObjs, pGVar13 != (Gia_Obj_t *)0x0)) {
    lVar18 = 0;
    do {
      uVar11 = *(ulong *)pGVar13;
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
        if (((int)pGVar13[-(uVar11 & 0x1fffffff)].Value < 0) ||
           (uVar4 = (uint)(uVar11 >> 0x20), (int)pGVar13[-(ulong)(uVar4 & 0x1fffffff)].Value < 0))
        goto LAB_001e380b;
        uVar4 = Gia_ManHashAnd(p,pGVar13[-(uVar11 & 0x1fffffff)].Value ^ (uint)(uVar11 >> 0x1d) & 1,
                               pGVar13[-(ulong)(uVar4 & 0x1fffffff)].Value ^ uVar4 >> 0x1d & 1);
        pGVar13->Value = uVar4;
      }
      lVar18 = lVar18 + 1;
      iVar5 = p1->nObjs;
    } while ((lVar18 < iVar5) && (pGVar13 = p1->pObjs + lVar18, p1->pObjs != (Gia_Obj_t *)0x0));
  }
  pGVar13 = p2->pObjs;
  pGVar13->Value = 0;
  pVVar9 = p2->vCis;
  uVar4 = pVVar9->nSize;
  uVar15 = uVar4 - p2->nRegs;
  if (uVar15 != 0 && p2->nRegs <= (int)uVar4) {
    uVar14 = 0;
    uVar11 = (ulong)uVar4;
    if ((int)uVar4 < 1) {
      uVar11 = uVar14;
    }
    do {
      if (uVar11 == uVar14) goto LAB_001e37ec;
      iVar12 = pVVar9->pArray[uVar14];
      if (((long)iVar12 < 0) || (p2->nObjs <= iVar12)) goto LAB_001e37ae;
      if (pGVar13 == (Gia_Obj_t *)0x0) break;
      if ((long)p1->nRegs <= (long)uVar14) {
        __assert_fail("v < Gia_ManRegNum(p)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManRo(Gia_Man_t *, int)");
      }
      iVar1 = p1->vCis->nSize;
      uVar17 = (uint)(iVar1 - p1->nRegs) + uVar14;
      iVar16 = (int)uVar17;
      if ((iVar16 < 0) || (iVar1 <= iVar16)) goto LAB_001e37ec;
      iVar1 = p1->vCis->pArray[uVar17 & 0xffffffff];
      if (((long)iVar1 < 0) || (iVar5 <= iVar1)) goto LAB_001e37ae;
      pGVar13[iVar12].Value = p1->pObjs[iVar1].Value;
      uVar14 = uVar14 + 1;
    } while (uVar15 != uVar14);
  }
  if (0 < p2->nObjs) {
    lVar18 = 8;
    lVar19 = 0;
    do {
      pGVar13 = p2->pObjs;
      if (pGVar13 == (Gia_Obj_t *)0x0) break;
      uVar11 = *(ulong *)((long)pGVar13 + lVar18 + -8);
      if ((uVar11 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar11) {
        uVar4 = *(uint *)((long)pGVar13 +
                         lVar18 + (ulong)(uint)((int)(uVar11 & 0x1fffffff) << 2) * -3);
        if (((int)uVar4 < 0) ||
           (uVar15 = *(uint *)((long)pGVar13 +
                              lVar18 + (ulong)((uint)(uVar11 >> 0x1e) & 0x7ffffffc) * -3),
           (int)uVar15 < 0)) goto LAB_001e380b;
        iVar5 = Gia_ManHashAnd(p,uVar4 ^ (uint)(uVar11 >> 0x1d) & 1,
                               uVar15 ^ (uint)(uVar11 >> 0x3d) & 1);
        *(int *)(&pGVar13->field_0x0 + lVar18) = iVar5;
      }
      lVar19 = lVar19 + 1;
      lVar18 = lVar18 + 0xc;
    } while (lVar19 < p2->nObjs);
  }
  pVVar9 = p2->vCos;
  uVar11 = (ulong)(uint)pVVar9->nSize;
  if (p2->nRegs < pVVar9->nSize) {
    lVar18 = 0;
    do {
      if ((int)uVar11 <= lVar18) goto LAB_001e37ec;
      iVar5 = pVVar9->pArray[lVar18];
      if (((long)iVar5 < 0) || (p2->nObjs <= iVar5)) goto LAB_001e37ae;
      if (p2->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar13 = p2->pObjs + iVar5;
      uVar15 = (uint)*(undefined8 *)pGVar13;
      uVar4 = pGVar13[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar4 < 0) goto LAB_001e380b;
      Gia_ManAppendCo(p,uVar15 >> 0x1d & 1 ^ uVar4);
      lVar18 = lVar18 + 1;
      pVVar9 = p2->vCos;
      uVar11 = (ulong)pVVar9->nSize;
    } while (lVar18 < (long)(uVar11 - (long)p2->nRegs));
  }
  iVar5 = p1->nRegs;
  if (0 < iVar5) {
    iVar12 = 0;
    do {
      iVar1 = p1->vCos->nSize;
      uVar4 = (iVar1 - iVar5) + iVar12;
      if (((int)uVar4 < 0) || (iVar1 <= (int)uVar4)) {
LAB_001e37ec:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar5 = p1->vCos->pArray[uVar4];
      if (((long)iVar5 < 0) || (p1->nObjs <= iVar5)) {
LAB_001e37ae:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/aig/gia/gia.h"
                      ,0x1cc,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p1->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar13 = p1->pObjs + iVar5;
      uVar15 = (uint)*(undefined8 *)pGVar13;
      uVar4 = pGVar13[-(ulong)(uVar15 & 0x1fffffff)].Value;
      if ((int)uVar4 < 0) {
LAB_001e380b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/abc_global.h"
                      ,0x132,"int Abc_LitNotCond(int, int)");
      }
      Gia_ManAppendCo(p,uVar15 >> 0x1d & 1 ^ uVar4);
      iVar12 = iVar12 + 1;
      iVar5 = p1->nRegs;
    } while (iVar12 < iVar5);
  }
  Gia_ManHashStop(p);
  Gia_ManSetRegNum(p,p1->nRegs);
  pGVar10 = Gia_ManCleanup(p);
  Gia_ManStop(p);
  return pGVar10;
}

Assistant:

Gia_Man_t * Gia_ManDupWithNewPo( Gia_Man_t * p1, Gia_Man_t * p2 )
{
    Gia_Man_t * pTemp, * pNew;
    Gia_Obj_t * pObj;
    int i;
    // there is no flops in p2
    assert( Gia_ManRegNum(p2) == 0 );
    // there is only one PO in p2
//    assert( Gia_ManPoNum(p2) == 1 );
    // input count of p2 is equal to flop count of p1 
    assert( Gia_ManPiNum(p2) == Gia_ManRegNum(p1) );

    // start new AIG
    pNew = Gia_ManStart( Gia_ManObjNum(p1)+Gia_ManObjNum(p2) );
    pNew->pName = Abc_UtilStrsav( p1->pName );
    pNew->pSpec = Abc_UtilStrsav( p1->pSpec );
    Gia_ManHashAlloc( pNew );
    // dup first AIG
    Gia_ManConst0(p1)->Value = 0;
    Gia_ManForEachCi( p1, pObj, i )
        pObj->Value = Gia_ManAppendCi(pNew);
    Gia_ManForEachAnd( p1, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // dup second AIG
    Gia_ManConst0(p2)->Value = 0;
    Gia_ManForEachPi( p2, pObj, i )
        pObj->Value = Gia_ManRo(p1, i)->Value;
    Gia_ManForEachAnd( p2, pObj, i )
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    // add property output
    Gia_ManForEachPo( p2, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    // add flop inputs
    Gia_ManForEachRi( p1, pObj, i )
        Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p1) );
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}